

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O0

MaybeResult<wasm::Continuation> *
wasm::WATParser::conttype<wasm::WATParser::ParseTypeDefsCtx>
          (MaybeResult<wasm::Continuation> *__return_storage_ptr__,ParseTypeDefsCtx *ctx)

{
  __index_type *__return_storage_ptr___00;
  undefined8 uVar1;
  undefined4 uVar2;
  bool bVar3;
  HeapTypeT *pHVar4;
  basic_string_view<char,_std::char_traits<char>_> expected;
  HeapTypeT ft;
  HeapType local_108;
  allocator<char> local_f9;
  string local_f8;
  Err local_d8;
  uint local_b4;
  Err local_b0;
  Err *local_90;
  Err *err;
  undefined1 local_78 [8];
  Result<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT> _val;
  Result<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT> x;
  ParseTypeDefsCtx *ctx_local;
  
  expected = sv("cont",4);
  bVar3 = Lexer::takeSExprStart(&ctx->in,expected);
  if (bVar3) {
    __return_storage_ptr___00 =
         (__index_type *)
         ((long)&_val.val.
                 super__Variant_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
                 .
                 super__Move_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
                 .
                 super__Copy_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
                 .
                 super__Move_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
                 .
                 super__Copy_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
         + 0x20);
    typeidx<wasm::WATParser::ParseTypeDefsCtx>
              ((Result<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT>
                *)__return_storage_ptr___00,ctx);
    Result<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT>::Result
              ((Result<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT>
                *)local_78,
               (Result<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT>
                *)__return_storage_ptr___00);
    local_90 = Result<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT>
               ::getErr((Result<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT>
                         *)local_78);
    bVar3 = local_90 != (Err *)0x0;
    if (bVar3) {
      wasm::Err::Err(&local_b0,local_90);
      MaybeResult<wasm::Continuation>::MaybeResult(__return_storage_ptr__,&local_b0);
      wasm::Err::~Err(&local_b0);
    }
    local_b4 = (uint)bVar3;
    Result<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT>::~Result
              ((Result<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT>
                *)local_78);
    if (local_b4 == 0) {
      bVar3 = Lexer::takeRParen(&ctx->in);
      if (bVar3) {
        pHVar4 = Result<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT>
                 ::operator*((Result<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT>
                              *)((long)&_val.val.
                                        super__Variant_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
                                        .
                                        super__Move_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
                                        .
                                        super__Copy_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
                                        .
                                        super__Move_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
                                        .
                                        super__Copy_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
                                + 0x20));
        uVar1 = pHVar4->type;
        uVar2 = pHVar4->exactness;
        ft.exactness = uVar2;
        ft.type.id = uVar1;
        ft._12_4_ = 0;
        local_108.id = (uintptr_t)
                       TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::makeContType
                                 (&ctx->super_TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>,ft);
        MaybeResult<wasm::Continuation>::MaybeResult<wasm::Continuation>
                  (__return_storage_ptr__,(Continuation *)&local_108);
        local_b4 = 1;
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_f8,"expected end of cont type",&local_f9);
        Lexer::err(&local_d8,&ctx->in,&local_f8);
        MaybeResult<wasm::Continuation>::MaybeResult(__return_storage_ptr__,&local_d8);
        wasm::Err::~Err(&local_d8);
        std::__cxx11::string::~string((string *)&local_f8);
        std::allocator<char>::~allocator(&local_f9);
        local_b4 = 1;
      }
    }
    Result<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT>::~Result
              ((Result<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT>
                *)((long)&_val.val.
                          super__Variant_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
                          .
                          super__Move_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
                          .
                          super__Copy_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
                          .
                          super__Move_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
                          .
                          super__Copy_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::HeapTypeT,_wasm::Err>
                  + 0x20));
  }
  else {
    MaybeResult<wasm::Continuation>::MaybeResult(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

MaybeResult<typename Ctx::ContinuationT> conttype(Ctx& ctx) {
  if (!ctx.in.takeSExprStart("cont"sv)) {
    return {};
  }

  auto x = typeidx(ctx);
  CHECK_ERR(x);

  if (!ctx.in.takeRParen()) {
    return ctx.in.err("expected end of cont type");
  }

  return ctx.makeContType(*x);
}